

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_sse.c
# Opt level: O0

void uavs3d_ipred_ang_xy_16_sse(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined4 uVar12;
  undefined6 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  long lVar20;
  int iVar21;
  undefined8 *puVar22;
  ushort uVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  short sVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i H3;
  __m128i H2_1;
  __m128i H1_1;
  __m128i H0_1;
  __m128i L3;
  __m128i L2_2;
  __m128i L1_2;
  __m128i L0_2;
  __m128i S2_2;
  __m128i S1_2;
  __m128i S3;
  __m128i S0_2;
  __m128i p11_1;
  __m128i p10_1;
  __m128i p01_2;
  __m128i p00_2;
  __m128i L2_1;
  __m128i L1_1;
  __m128i L0_1;
  __m128i S1_1;
  __m128i S2_1;
  __m128i S0_1;
  __m128i p01_1;
  __m128i p00_1;
  __m128i H2;
  __m128i H1;
  __m128i H0;
  __m128i L2;
  __m128i L1;
  __m128i L0;
  __m128i S1;
  __m128i S2;
  __m128i S0;
  __m128i p11;
  __m128i p10;
  __m128i p01;
  __m128i p00;
  pel *src1;
  int i;
  __m128i shuffle2;
  __m128i shuffle1;
  __m128i coeff4;
  __m128i coeff3;
  __m128i coeff2;
  __m128i zero;
  pel *pfirst [2];
  int aligned_line_size;
  int left_size;
  int line_size;
  pel first_line [224];
  int height_local;
  int width_local;
  int mode_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short sStack_8be;
  short sStack_8bc;
  short sStack_8ba;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  ushort uStack_876;
  ushort uStack_874;
  ushort uStack_872;
  ushort uStack_86e;
  ushort uStack_86c;
  ushort uStack_86a;
  ushort uStack_866;
  ushort uStack_864;
  ushort uStack_862;
  ushort uStack_85e;
  ushort uStack_85c;
  ushort uStack_85a;
  ushort uStack_856;
  ushort uStack_854;
  ushort uStack_852;
  ushort uStack_84e;
  ushort uStack_84c;
  ushort uStack_84a;
  ushort uStack_846;
  ushort uStack_844;
  ushort uStack_842;
  ushort uStack_83e;
  ushort uStack_83c;
  ushort uStack_83a;
  ushort uStack_836;
  ushort uStack_834;
  ushort uStack_832;
  ushort uStack_82e;
  ushort uStack_82c;
  ushort uStack_82a;
  ushort uStack_826;
  ushort uStack_824;
  ushort uStack_822;
  ushort uStack_81e;
  ushort uStack_81c;
  ushort uStack_81a;
  ushort uStack_816;
  ushort uStack_814;
  ushort uStack_812;
  ushort uStack_80e;
  ushort uStack_80c;
  ushort uStack_80a;
  ushort uStack_806;
  ushort uStack_804;
  ushort uStack_802;
  ushort uStack_7fe;
  ushort uStack_7fc;
  ushort uStack_7fa;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  ushort uStack_776;
  ushort uStack_774;
  ushort uStack_772;
  ushort uStack_76e;
  ushort uStack_76c;
  ushort uStack_76a;
  ushort uStack_766;
  ushort uStack_764;
  ushort uStack_762;
  ushort uStack_75e;
  ushort uStack_75c;
  ushort uStack_75a;
  ushort uStack_756;
  ushort uStack_754;
  ushort uStack_752;
  ushort uStack_74e;
  ushort uStack_74c;
  ushort uStack_74a;
  ushort uStack_746;
  ushort uStack_744;
  ushort uStack_742;
  ushort uStack_73e;
  ushort uStack_73c;
  ushort uStack_73a;
  ushort uStack_736;
  ushort uStack_734;
  ushort uStack_732;
  ushort uStack_72e;
  ushort uStack_72c;
  ushort uStack_72a;
  ushort uStack_726;
  ushort uStack_724;
  ushort uStack_722;
  ushort uStack_71e;
  ushort uStack_71c;
  ushort uStack_71a;
  ushort uStack_716;
  ushort uStack_714;
  ushort uStack_712;
  ushort uStack_70e;
  ushort uStack_70c;
  ushort uStack_70a;
  ushort uStack_706;
  ushort uStack_704;
  ushort uStack_702;
  ushort uStack_6fe;
  ushort uStack_6fc;
  ushort uStack_6fa;
  ushort uStack_6b6;
  ushort uStack_6b4;
  ushort uStack_6b2;
  ushort uStack_6ae;
  ushort uStack_6ac;
  ushort uStack_6aa;
  ushort uStack_6a6;
  ushort uStack_6a4;
  ushort uStack_6a2;
  ushort uStack_69e;
  ushort uStack_69c;
  ushort uStack_69a;
  ushort uStack_696;
  ushort uStack_694;
  ushort uStack_692;
  ushort uStack_68e;
  ushort uStack_68c;
  ushort uStack_68a;
  ushort uStack_686;
  ushort uStack_684;
  ushort uStack_682;
  ushort uStack_67e;
  ushort uStack_67c;
  ushort uStack_67a;
  ushort uStack_5f6;
  ushort uStack_5f4;
  ushort uStack_5f2;
  ushort uStack_5ee;
  ushort uStack_5ec;
  ushort uStack_5ea;
  ushort uStack_5e6;
  ushort uStack_5e4;
  ushort uStack_5e2;
  ushort uStack_5de;
  ushort uStack_5dc;
  ushort uStack_5da;
  ushort uStack_5d6;
  ushort uStack_5d4;
  ushort uStack_5d2;
  ushort uStack_5ce;
  ushort uStack_5cc;
  ushort uStack_5ca;
  ushort uStack_5c6;
  ushort uStack_5c4;
  ushort uStack_5c2;
  ushort uStack_5be;
  ushort uStack_5bc;
  ushort uStack_5ba;
  ushort uStack_5b6;
  ushort uStack_5b4;
  ushort uStack_5b2;
  ushort uStack_5ae;
  ushort uStack_5ac;
  ushort uStack_5aa;
  ushort uStack_5a6;
  ushort uStack_5a4;
  ushort uStack_5a2;
  ushort uStack_59e;
  ushort uStack_59c;
  ushort uStack_59a;
  ushort uStack_596;
  ushort uStack_594;
  ushort uStack_592;
  ushort uStack_58e;
  ushort uStack_58c;
  ushort uStack_58a;
  ushort uStack_586;
  ushort uStack_584;
  ushort uStack_582;
  ushort uStack_57e;
  ushort uStack_57c;
  ushort uStack_57a;
  short sStack_4e6;
  short sStack_4e4;
  short sStack_4e2;
  short sStack_4de;
  short sStack_4dc;
  short sStack_4da;
  ushort uStack_4c6;
  ushort uStack_4c4;
  ushort uStack_4c2;
  ushort uStack_4be;
  ushort uStack_4bc;
  ushort uStack_4ba;
  ushort uStack_4a6;
  ushort uStack_4a4;
  ushort uStack_4a2;
  ushort uStack_49e;
  ushort uStack_49c;
  ushort uStack_49a;
  byte local_448;
  byte bStack_447;
  byte bStack_446;
  byte bStack_445;
  byte bStack_444;
  byte bStack_443;
  byte bStack_442;
  byte bStack_441;
  byte local_428;
  byte bStack_427;
  byte bStack_426;
  byte bStack_425;
  byte bStack_424;
  byte bStack_423;
  byte bStack_422;
  byte bStack_421;
  byte local_408;
  byte bStack_407;
  byte bStack_406;
  byte bStack_405;
  byte bStack_404;
  byte bStack_403;
  byte bStack_402;
  byte bStack_401;
  byte local_3e8;
  byte bStack_3e7;
  byte bStack_3e6;
  byte bStack_3e5;
  byte bStack_3e4;
  byte bStack_3e3;
  byte bStack_3e2;
  byte bStack_3e1;
  byte local_3c8;
  byte bStack_3c7;
  byte bStack_3c6;
  byte bStack_3c5;
  byte bStack_3c4;
  byte bStack_3c3;
  byte bStack_3c2;
  byte bStack_3c1;
  byte local_3a8;
  byte bStack_3a7;
  byte bStack_3a6;
  byte bStack_3a5;
  byte bStack_3a4;
  byte bStack_3a3;
  byte bStack_3a2;
  byte bStack_3a1;
  byte local_388;
  byte bStack_387;
  byte bStack_386;
  byte bStack_385;
  byte bStack_384;
  byte bStack_383;
  byte bStack_382;
  byte bStack_381;
  byte local_368;
  byte bStack_367;
  byte bStack_366;
  byte bStack_365;
  byte bStack_364;
  byte bStack_363;
  byte bStack_362;
  byte bStack_361;
  byte local_348;
  byte bStack_347;
  byte bStack_346;
  byte bStack_345;
  byte bStack_344;
  byte bStack_343;
  byte bStack_342;
  byte bStack_341;
  byte local_328;
  byte bStack_327;
  byte bStack_326;
  byte bStack_325;
  byte bStack_324;
  byte bStack_323;
  byte bStack_322;
  byte bStack_321;
  undefined4 local_318;
  undefined4 local_2f8;
  byte bStack_2c0;
  byte bStack_2bf;
  byte bStack_2be;
  byte bStack_2bd;
  byte bStack_2bc;
  byte bStack_2bb;
  byte bStack_2ba;
  byte bStack_2b9;
  byte bStack_2a0;
  byte bStack_29f;
  byte bStack_29e;
  byte bStack_29d;
  byte bStack_29c;
  byte bStack_29b;
  byte bStack_29a;
  byte bStack_299;
  byte bStack_280;
  byte bStack_27f;
  byte bStack_27e;
  byte bStack_27d;
  byte bStack_27c;
  byte bStack_27b;
  byte bStack_27a;
  byte bStack_279;
  byte bStack_260;
  byte bStack_25f;
  byte bStack_25e;
  byte bStack_25d;
  byte bStack_25c;
  byte bStack_25b;
  byte bStack_25a;
  byte bStack_259;
  byte bStack_240;
  byte bStack_23f;
  byte bStack_23e;
  byte bStack_23d;
  byte bStack_23c;
  byte bStack_23b;
  byte bStack_23a;
  byte bStack_239;
  byte bStack_220;
  byte bStack_21f;
  byte bStack_21e;
  byte bStack_21d;
  byte bStack_21c;
  byte bStack_21b;
  byte bStack_21a;
  byte bStack_219;
  byte bStack_200;
  byte bStack_1ff;
  byte bStack_1fe;
  byte bStack_1fd;
  byte bStack_1fc;
  byte bStack_1fb;
  byte bStack_1fa;
  byte bStack_1f9;
  ushort uStack_1c6;
  ushort uStack_1c4;
  ushort uStack_1c2;
  ushort uStack_1be;
  ushort uStack_1bc;
  ushort uStack_1ba;
  ushort uStack_186;
  ushort uStack_184;
  ushort uStack_182;
  ushort uStack_17e;
  ushort uStack_17c;
  ushort uStack_17a;
  
  iVar1 = width + -1 + height / 2;
  iVar21 = iVar1 - width;
  lVar20 = (long)(int)(iVar1 + 0x1fU & 0xfffffff0) + -0xad8;
  first_line._216_4_ = height;
  first_line._220_4_ = width;
  dst_local = src + -(long)(height + -2);
  for (src1._4_4_ = 0; src1._4_4_ < iVar21 + -4; src1._4_4_ = src1._4_4_ + 8) {
    uVar2 = *(undefined8 *)(dst_local + -1);
    uVar3 = *(undefined8 *)(dst_local + 7);
    uVar4 = *(undefined8 *)(dst_local + 1);
    uVar5 = *(undefined8 *)(dst_local + 9);
    uVar6 = *(undefined8 *)dst_local;
    uVar7 = *(undefined8 *)(dst_local + 8);
    local_328 = (byte)uVar2;
    bStack_327 = (byte)((ulong)uVar2 >> 8);
    bStack_326 = (byte)((ulong)uVar2 >> 0x10);
    bStack_325 = (byte)((ulong)uVar2 >> 0x18);
    bStack_324 = (byte)((ulong)uVar2 >> 0x20);
    bStack_323 = (byte)((ulong)uVar2 >> 0x28);
    bStack_322 = (byte)((ulong)uVar2 >> 0x30);
    bStack_321 = (byte)((ulong)uVar2 >> 0x38);
    local_348 = (byte)uVar6;
    bStack_347 = (byte)((ulong)uVar6 >> 8);
    bStack_346 = (byte)((ulong)uVar6 >> 0x10);
    bStack_345 = (byte)((ulong)uVar6 >> 0x18);
    bStack_344 = (byte)((ulong)uVar6 >> 0x20);
    bStack_343 = (byte)((ulong)uVar6 >> 0x28);
    bStack_342 = (byte)((ulong)uVar6 >> 0x30);
    bStack_341 = (byte)((ulong)uVar6 >> 0x38);
    local_368 = (byte)uVar4;
    bStack_367 = (byte)((ulong)uVar4 >> 8);
    bStack_366 = (byte)((ulong)uVar4 >> 0x10);
    bStack_365 = (byte)((ulong)uVar4 >> 0x18);
    bStack_364 = (byte)((ulong)uVar4 >> 0x20);
    bStack_363 = (byte)((ulong)uVar4 >> 0x28);
    bStack_362 = (byte)((ulong)uVar4 >> 0x30);
    bStack_361 = (byte)((ulong)uVar4 >> 0x38);
    bStack_200 = (byte)uVar3;
    bStack_1ff = (byte)((ulong)uVar3 >> 8);
    bStack_1fe = (byte)((ulong)uVar3 >> 0x10);
    bStack_1fd = (byte)((ulong)uVar3 >> 0x18);
    bStack_1fc = (byte)((ulong)uVar3 >> 0x20);
    bStack_1fb = (byte)((ulong)uVar3 >> 0x28);
    bStack_1fa = (byte)((ulong)uVar3 >> 0x30);
    bStack_1f9 = (byte)((ulong)uVar3 >> 0x38);
    bStack_220 = (byte)uVar7;
    bStack_21f = (byte)((ulong)uVar7 >> 8);
    bStack_21e = (byte)((ulong)uVar7 >> 0x10);
    bStack_21d = (byte)((ulong)uVar7 >> 0x18);
    bStack_21c = (byte)((ulong)uVar7 >> 0x20);
    bStack_21b = (byte)((ulong)uVar7 >> 0x28);
    bStack_21a = (byte)((ulong)uVar7 >> 0x30);
    bStack_219 = (byte)((ulong)uVar7 >> 0x38);
    bStack_240 = (byte)uVar5;
    bStack_23f = (byte)((ulong)uVar5 >> 8);
    bStack_23e = (byte)((ulong)uVar5 >> 0x10);
    bStack_23d = (byte)((ulong)uVar5 >> 0x18);
    bStack_23c = (byte)((ulong)uVar5 >> 0x20);
    bStack_23b = (byte)((ulong)uVar5 >> 0x28);
    bStack_23a = (byte)((ulong)uVar5 >> 0x30);
    bStack_239 = (byte)((ulong)uVar5 >> 0x38);
    uStack_586 = (ushort)bStack_327;
    uStack_584 = (ushort)bStack_326;
    uStack_582 = (ushort)bStack_325;
    uStack_57e = (ushort)bStack_323;
    uStack_57c = (ushort)bStack_322;
    uStack_57a = (ushort)bStack_321;
    uStack_596 = (ushort)bStack_347;
    uStack_594 = (ushort)bStack_346;
    uStack_592 = (ushort)bStack_345;
    uStack_58e = (ushort)bStack_343;
    uStack_58c = (ushort)bStack_342;
    uStack_58a = (ushort)bStack_341;
    uStack_5a6 = (ushort)bStack_347;
    uStack_5a4 = (ushort)bStack_346;
    uStack_5a2 = (ushort)bStack_345;
    uStack_59e = (ushort)bStack_343;
    uStack_59c = (ushort)bStack_342;
    uStack_59a = (ushort)bStack_341;
    uStack_5b6 = (ushort)bStack_367;
    uStack_5b4 = (ushort)bStack_366;
    uStack_5b2 = (ushort)bStack_365;
    uStack_5ae = (ushort)bStack_363;
    uStack_5ac = (ushort)bStack_362;
    uStack_5aa = (ushort)bStack_361;
    uStack_5c6 = (ushort)bStack_1ff;
    uStack_5c4 = (ushort)bStack_1fe;
    uStack_5c2 = (ushort)bStack_1fd;
    uStack_5be = (ushort)bStack_1fb;
    uStack_5bc = (ushort)bStack_1fa;
    uStack_5ba = (ushort)bStack_1f9;
    uStack_5d6 = (ushort)bStack_21f;
    uStack_5d4 = (ushort)bStack_21e;
    uStack_5d2 = (ushort)bStack_21d;
    uStack_5ce = (ushort)bStack_21b;
    uStack_5cc = (ushort)bStack_21a;
    uStack_5ca = (ushort)bStack_219;
    uStack_5e6 = (ushort)bStack_21f;
    uStack_5e4 = (ushort)bStack_21e;
    uStack_5e2 = (ushort)bStack_21d;
    uStack_5de = (ushort)bStack_21b;
    uStack_5dc = (ushort)bStack_21a;
    uStack_5da = (ushort)bStack_219;
    uStack_5f6 = (ushort)bStack_23f;
    uStack_5f4 = (ushort)bStack_23e;
    uStack_5f2 = (ushort)bStack_23d;
    uStack_5ee = (ushort)bStack_23b;
    uStack_5ec = (ushort)bStack_23a;
    uStack_5ea = (ushort)bStack_239;
    uVar23 = (ushort)((ushort)local_328 + (ushort)local_348 + 2 +
                     (ushort)local_348 + (ushort)local_368) >> 2;
    uVar29 = (ushort)(uStack_586 + uStack_596 + 2 + uStack_5a6 + uStack_5b6) >> 2;
    uVar31 = (ushort)(uStack_584 + uStack_594 + 2 + uStack_5a4 + uStack_5b4) >> 2;
    uVar33 = (ushort)(uStack_582 + uStack_592 + 2 + uStack_5a2 + uStack_5b2) >> 2;
    uVar35 = (ushort)((ushort)bStack_324 + (ushort)bStack_344 + 2 +
                     (ushort)bStack_344 + (ushort)bStack_364) >> 2;
    uVar38 = (ushort)(uStack_57e + uStack_58e + 2 + uStack_59e + uStack_5ae) >> 2;
    uVar40 = (ushort)(uStack_57c + uStack_58c + 2 + uStack_59c + uStack_5ac) >> 2;
    uVar42 = (ushort)(uStack_57a + uStack_58a + 2 + uStack_59a + uStack_5aa) >> 2;
    uVar24 = (ushort)((ushort)bStack_200 + (ushort)bStack_220 + 2 +
                     (ushort)bStack_220 + (ushort)bStack_240) >> 2;
    uVar30 = (ushort)(uStack_5c6 + uStack_5d6 + 2 + uStack_5e6 + uStack_5f6) >> 2;
    uVar32 = (ushort)(uStack_5c4 + uStack_5d4 + 2 + uStack_5e4 + uStack_5f4) >> 2;
    uVar34 = (ushort)(uStack_5c2 + uStack_5d2 + 2 + uStack_5e2 + uStack_5f2) >> 2;
    uVar36 = (ushort)((ushort)bStack_1fc + (ushort)bStack_21c + 2 +
                     (ushort)bStack_21c + (ushort)bStack_23c) >> 2;
    uVar39 = (ushort)(uStack_5be + uStack_5ce + 2 + uStack_5de + uStack_5ee) >> 2;
    uVar41 = (ushort)(uStack_5bc + uStack_5cc + 2 + uStack_5dc + uStack_5ec) >> 2;
    uVar43 = (ushort)(uStack_5ba + uStack_5ca + 2 + uStack_5da + uStack_5ea) >> 2;
    p01[1] = CONCAT17((uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42),
                      CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40),
                               CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 -
                                        (0xff < uVar38),
                                        CONCAT14((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 -
                                                 (0xff < uVar35),
                                                 CONCAT13((uVar33 != 0) * (uVar33 < 0x100) *
                                                          (char)uVar33 - (0xff < uVar33),
                                                          CONCAT12((uVar31 != 0) * (uVar31 < 0x100)
                                                                   * (char)uVar31 - (0xff < uVar31),
                                                                   CONCAT11((uVar29 != 0) *
                                                                            (uVar29 < 0x100) *
                                                                            (char)uVar29 -
                                                                            (0xff < uVar29),
                                                                            (uVar23 != 0) *
                                                                            (uVar23 < 0x100) *
                                                                            (char)uVar23 -
                                                                            (0xff < uVar23))))))));
    p00[0]._0_1_ = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    p00[0]._1_1_ = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    p00[0]._2_1_ = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    p00[0]._3_1_ = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    p00[0]._4_1_ = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
    p00[0]._5_1_ = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    p00[0]._6_1_ = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
    p00[0]._7_1_ = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
    auVar18._8_8_ = p00[0];
    auVar18._0_8_ = p01[1];
    auVar26._8_8_ = 0xe0c0a0806040200;
    auVar26._0_8_ = 0xf0d0b0907050301;
    auVar26 = pshufb(auVar18,auVar26);
    auVar28._8_8_ = p00[0];
    auVar28._0_8_ = p01[1];
    auVar27._8_8_ = 0xf0d0b0907050301;
    auVar27._0_8_ = 0xe0c0a0806040200;
    auVar27 = pshufb(auVar28,auVar27);
    p01[1] = auVar27._0_8_;
    *(longlong *)((long)&left_size + src1._4_4_ + lVar20 + 0xad8) = p01[1];
    p11[1] = auVar26._0_8_;
    *(longlong *)((long)&left_size + (long)src1._4_4_) = p11[1];
    dst_local = dst_local + 0x10;
  }
  if (src1._4_4_ < iVar21) {
    uVar2 = *(undefined8 *)(dst_local + -1);
    uVar3 = *(undefined8 *)(dst_local + 1);
    uVar4 = *(undefined8 *)dst_local;
    local_388 = (byte)uVar2;
    bStack_387 = (byte)((ulong)uVar2 >> 8);
    bStack_386 = (byte)((ulong)uVar2 >> 0x10);
    bStack_385 = (byte)((ulong)uVar2 >> 0x18);
    bStack_384 = (byte)((ulong)uVar2 >> 0x20);
    bStack_383 = (byte)((ulong)uVar2 >> 0x28);
    bStack_382 = (byte)((ulong)uVar2 >> 0x30);
    bStack_381 = (byte)((ulong)uVar2 >> 0x38);
    local_3a8 = (byte)uVar4;
    bStack_3a7 = (byte)((ulong)uVar4 >> 8);
    bStack_3a6 = (byte)((ulong)uVar4 >> 0x10);
    bStack_3a5 = (byte)((ulong)uVar4 >> 0x18);
    bStack_3a4 = (byte)((ulong)uVar4 >> 0x20);
    bStack_3a3 = (byte)((ulong)uVar4 >> 0x28);
    bStack_3a2 = (byte)((ulong)uVar4 >> 0x30);
    bStack_3a1 = (byte)((ulong)uVar4 >> 0x38);
    local_3c8 = (byte)uVar3;
    bStack_3c7 = (byte)((ulong)uVar3 >> 8);
    bStack_3c6 = (byte)((ulong)uVar3 >> 0x10);
    bStack_3c5 = (byte)((ulong)uVar3 >> 0x18);
    bStack_3c4 = (byte)((ulong)uVar3 >> 0x20);
    bStack_3c3 = (byte)((ulong)uVar3 >> 0x28);
    bStack_3c2 = (byte)((ulong)uVar3 >> 0x30);
    bStack_3c1 = (byte)((ulong)uVar3 >> 0x38);
    uStack_686 = (ushort)bStack_387;
    uStack_684 = (ushort)bStack_386;
    uStack_682 = (ushort)bStack_385;
    uStack_67e = (ushort)bStack_383;
    uStack_67c = (ushort)bStack_382;
    uStack_67a = (ushort)bStack_381;
    uStack_696 = (ushort)bStack_3a7;
    uStack_694 = (ushort)bStack_3a6;
    uStack_692 = (ushort)bStack_3a5;
    uStack_68e = (ushort)bStack_3a3;
    uStack_68c = (ushort)bStack_3a2;
    uStack_68a = (ushort)bStack_3a1;
    uStack_6a6 = (ushort)bStack_3a7;
    uStack_6a4 = (ushort)bStack_3a6;
    uStack_6a2 = (ushort)bStack_3a5;
    uStack_69e = (ushort)bStack_3a3;
    uStack_69c = (ushort)bStack_3a2;
    uStack_69a = (ushort)bStack_3a1;
    uStack_6b6 = (ushort)bStack_3c7;
    uStack_6b4 = (ushort)bStack_3c6;
    uStack_6b2 = (ushort)bStack_3c5;
    uStack_6ae = (ushort)bStack_3c3;
    uStack_6ac = (ushort)bStack_3c2;
    uStack_6aa = (ushort)bStack_3c1;
    uVar23 = (ushort)((ushort)local_388 + (ushort)local_3a8 + 2 +
                     (ushort)local_3a8 + (ushort)local_3c8) >> 2;
    uVar24 = (ushort)(uStack_686 + uStack_696 + 2 + uStack_6a6 + uStack_6b6) >> 2;
    uVar29 = (ushort)(uStack_684 + uStack_694 + 2 + uStack_6a4 + uStack_6b4) >> 2;
    uVar30 = (ushort)(uStack_682 + uStack_692 + 2 + uStack_6a2 + uStack_6b2) >> 2;
    uVar31 = (ushort)((ushort)bStack_384 + (ushort)bStack_3a4 + 2 +
                     (ushort)bStack_3a4 + (ushort)bStack_3c4) >> 2;
    uVar32 = (ushort)(uStack_67e + uStack_68e + 2 + uStack_69e + uStack_6ae) >> 2;
    uVar33 = (ushort)(uStack_67c + uStack_68c + 2 + uStack_69c + uStack_6ac) >> 2;
    uVar34 = (ushort)(uStack_67a + uStack_68a + 2 + uStack_69a + uStack_6aa) >> 2;
    p01_1[1] = CONCAT17((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34),
                        CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33),
                                 CONCAT15((uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 -
                                          (0xff < uVar32),
                                          CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 -
                                                   (0xff < uVar31),
                                                   CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                            (char)uVar30 - (0xff < uVar30),
                                                            CONCAT12((uVar29 != 0) *
                                                                     (uVar29 < 0x100) * (char)uVar29
                                                                     - (0xff < uVar29),
                                                                     CONCAT11((uVar24 != 0) *
                                                                              (uVar24 < 0x100) *
                                                                              (char)uVar24 -
                                                                              (0xff < uVar24),
                                                                              (uVar23 != 0) *
                                                                              (uVar23 < 0x100) *
                                                                              (char)uVar23 -
                                                                              (0xff < uVar23))))))))
    ;
    p00_1[0]._0_1_ = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
    p00_1[0]._1_1_ = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    p00_1[0]._2_1_ = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    p00_1[0]._3_1_ = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    p00_1[0]._4_1_ = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    p00_1[0]._5_1_ = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    p00_1[0]._6_1_ = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    p00_1[0]._7_1_ = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    auVar17._8_8_ = p00_1[0];
    auVar17._0_8_ = p01_1[1];
    auVar16._8_8_ = 0xe0c0a0806040200;
    auVar16._0_8_ = 0xf0d0b0907050301;
    auVar27 = pshufb(auVar17,auVar16);
    auVar15._8_8_ = p00_1[0];
    auVar15._0_8_ = p01_1[1];
    auVar14._8_8_ = 0xf0d0b0907050301;
    auVar14._0_8_ = 0xe0c0a0806040200;
    auVar28 = pshufb(auVar15,auVar14);
    local_2f8 = auVar28._0_4_;
    *(undefined4 *)((long)&left_size + src1._4_4_ + lVar20 + 0xad8) = local_2f8;
    local_318 = auVar27._0_4_;
    *(undefined4 *)((long)&left_size + (long)src1._4_4_) = local_318;
  }
  dst_local = src + -(long)(height + -2) + (long)iVar21 + (long)iVar21;
  for (src1._4_4_ = iVar21; src1._4_4_ < iVar1; src1._4_4_ = src1._4_4_ + 0x10) {
    uVar2 = *(undefined8 *)(dst_local + -1);
    uVar3 = *(undefined8 *)(dst_local + 7);
    uVar4 = *(undefined8 *)(dst_local + 2);
    uVar5 = *(undefined8 *)(dst_local + 10);
    uVar6 = *(undefined8 *)dst_local;
    uVar7 = *(undefined8 *)(dst_local + 8);
    uVar8 = *(undefined8 *)(dst_local + 1);
    uVar9 = *(undefined8 *)(dst_local + 9);
    local_3e8 = (byte)uVar2;
    bStack_3e7 = (byte)((ulong)uVar2 >> 8);
    bStack_3e6 = (byte)((ulong)uVar2 >> 0x10);
    bStack_3e5 = (byte)((ulong)uVar2 >> 0x18);
    bStack_3e4 = (byte)((ulong)uVar2 >> 0x20);
    bStack_3e3 = (byte)((ulong)uVar2 >> 0x28);
    bStack_3e2 = (byte)((ulong)uVar2 >> 0x30);
    bStack_3e1 = (byte)((ulong)uVar2 >> 0x38);
    local_408 = (byte)uVar6;
    bStack_407 = (byte)((ulong)uVar6 >> 8);
    bStack_406 = (byte)((ulong)uVar6 >> 0x10);
    bStack_405 = (byte)((ulong)uVar6 >> 0x18);
    bStack_404 = (byte)((ulong)uVar6 >> 0x20);
    bStack_403 = (byte)((ulong)uVar6 >> 0x28);
    bStack_402 = (byte)((ulong)uVar6 >> 0x30);
    bStack_401 = (byte)((ulong)uVar6 >> 0x38);
    local_428 = (byte)uVar8;
    bStack_427 = (byte)((ulong)uVar8 >> 8);
    bStack_426 = (byte)((ulong)uVar8 >> 0x10);
    bStack_425 = (byte)((ulong)uVar8 >> 0x18);
    bStack_424 = (byte)((ulong)uVar8 >> 0x20);
    bStack_423 = (byte)((ulong)uVar8 >> 0x28);
    bStack_422 = (byte)((ulong)uVar8 >> 0x30);
    bStack_421 = (byte)((ulong)uVar8 >> 0x38);
    local_448 = (byte)uVar4;
    bStack_447 = (byte)((ulong)uVar4 >> 8);
    bStack_446 = (byte)((ulong)uVar4 >> 0x10);
    bStack_445 = (byte)((ulong)uVar4 >> 0x18);
    bStack_444 = (byte)((ulong)uVar4 >> 0x20);
    bStack_443 = (byte)((ulong)uVar4 >> 0x28);
    bStack_442 = (byte)((ulong)uVar4 >> 0x30);
    bStack_441 = (byte)((ulong)uVar4 >> 0x38);
    bStack_260 = (byte)uVar3;
    bStack_25f = (byte)((ulong)uVar3 >> 8);
    bStack_25e = (byte)((ulong)uVar3 >> 0x10);
    bStack_25d = (byte)((ulong)uVar3 >> 0x18);
    bStack_25c = (byte)((ulong)uVar3 >> 0x20);
    bStack_25b = (byte)((ulong)uVar3 >> 0x28);
    bStack_25a = (byte)((ulong)uVar3 >> 0x30);
    bStack_259 = (byte)((ulong)uVar3 >> 0x38);
    bStack_280 = (byte)uVar7;
    bStack_27f = (byte)((ulong)uVar7 >> 8);
    bStack_27e = (byte)((ulong)uVar7 >> 0x10);
    bStack_27d = (byte)((ulong)uVar7 >> 0x18);
    bStack_27c = (byte)((ulong)uVar7 >> 0x20);
    bStack_27b = (byte)((ulong)uVar7 >> 0x28);
    bStack_27a = (byte)((ulong)uVar7 >> 0x30);
    bStack_279 = (byte)((ulong)uVar7 >> 0x38);
    bStack_2a0 = (byte)uVar9;
    bStack_29f = (byte)((ulong)uVar9 >> 8);
    bStack_29e = (byte)((ulong)uVar9 >> 0x10);
    bStack_29d = (byte)((ulong)uVar9 >> 0x18);
    bStack_29c = (byte)((ulong)uVar9 >> 0x20);
    bStack_29b = (byte)((ulong)uVar9 >> 0x28);
    bStack_29a = (byte)((ulong)uVar9 >> 0x30);
    bStack_299 = (byte)((ulong)uVar9 >> 0x38);
    bStack_2c0 = (byte)uVar5;
    bStack_2bf = (byte)((ulong)uVar5 >> 8);
    bStack_2be = (byte)((ulong)uVar5 >> 0x10);
    bStack_2bd = (byte)((ulong)uVar5 >> 0x18);
    bStack_2bc = (byte)((ulong)uVar5 >> 0x20);
    bStack_2bb = (byte)((ulong)uVar5 >> 0x28);
    bStack_2ba = (byte)((ulong)uVar5 >> 0x30);
    bStack_2b9 = (byte)((ulong)uVar5 >> 0x38);
    uStack_706 = (ushort)bStack_407;
    uStack_704 = (ushort)bStack_406;
    uStack_702 = (ushort)bStack_405;
    uStack_6fe = (ushort)bStack_403;
    uStack_6fc = (ushort)bStack_402;
    uStack_6fa = (ushort)bStack_401;
    uStack_716 = (ushort)bStack_427;
    uStack_714 = (ushort)bStack_426;
    uStack_712 = (ushort)bStack_425;
    uStack_70e = (ushort)bStack_423;
    uStack_70c = (ushort)bStack_422;
    uStack_70a = (ushort)bStack_421;
    p01_2[1]._2_1_ = (char)(uStack_706 + uStack_716);
    p01_2[1]._3_1_ = (byte)((ushort)(uStack_706 + uStack_716) >> 8);
    p01_2[1]._4_1_ = (char)(uStack_704 + uStack_714);
    p01_2[1]._5_1_ = (byte)((ushort)(uStack_704 + uStack_714) >> 8);
    p01_2[1]._6_1_ = (char)(uStack_702 + uStack_712);
    p01_2[1]._7_1_ = (byte)((ushort)(uStack_702 + uStack_712) >> 8);
    p00_2[0]._2_1_ = (char)(uStack_6fe + uStack_70e);
    p00_2[0]._3_1_ = (byte)((ushort)(uStack_6fe + uStack_70e) >> 8);
    p00_2[0]._4_1_ = (char)(uStack_6fc + uStack_70c);
    p00_2[0]._5_1_ = (byte)((ushort)(uStack_6fc + uStack_70c) >> 8);
    p00_2[0]._6_1_ = (char)(uStack_6fa + uStack_70a);
    p00_2[0]._7_1_ = (byte)((ushort)(uStack_6fa + uStack_70a) >> 8);
    uStack_726 = (ushort)bStack_27f;
    uStack_724 = (ushort)bStack_27e;
    uStack_722 = (ushort)bStack_27d;
    uStack_71e = (ushort)bStack_27b;
    uStack_71c = (ushort)bStack_27a;
    uStack_71a = (ushort)bStack_279;
    uStack_736 = (ushort)bStack_29f;
    uStack_734 = (ushort)bStack_29e;
    uStack_732 = (ushort)bStack_29d;
    uStack_72e = (ushort)bStack_29b;
    uStack_72c = (ushort)bStack_29a;
    uStack_72a = (ushort)bStack_299;
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,(ushort)local_408 + (ushort)local_428))
    ;
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,
                      CONCAT12(p00_2[0]._2_1_,(ushort)bStack_404 + (ushort)bStack_424));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    sStack_4e6 = (short)((uint)uVar10 >> 0x10);
    sStack_4e4 = (short)((uint6)uVar11 >> 0x20);
    sStack_4e2 = (short)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x30);
    sStack_4de = (short)((uint)uVar12 >> 0x10);
    sStack_4dc = (short)((uint6)uVar13 >> 0x20);
    sStack_4da = (short)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x30);
    sVar25 = ((ushort)local_408 + (ushort)local_428) * 3;
    sVar37 = ((ushort)bStack_404 + (ushort)bStack_424) * 3;
    p01_2[1]._2_1_ = (char)(sStack_4e6 * 3);
    p01_2[1]._3_1_ = (byte)((ushort)(sStack_4e6 * 3) >> 8);
    p01_2[1]._4_1_ = (char)(sStack_4e4 * 3);
    p01_2[1]._5_1_ = (byte)((ushort)(sStack_4e4 * 3) >> 8);
    p01_2[1]._6_1_ = (char)(sStack_4e2 * 3);
    p01_2[1]._7_1_ = (byte)((ushort)(sStack_4e2 * 3) >> 8);
    p00_2[0]._2_1_ = (char)(sStack_4de * 3);
    p00_2[0]._3_1_ = (byte)((ushort)(sStack_4de * 3) >> 8);
    p00_2[0]._4_1_ = (char)(sStack_4dc * 3);
    p00_2[0]._5_1_ = (byte)((ushort)(sStack_4dc * 3) >> 8);
    p00_2[0]._6_1_ = (char)(sStack_4da * 3);
    p00_2[0]._7_1_ = (byte)((ushort)(sStack_4da * 3) >> 8);
    uStack_746 = (ushort)bStack_3e7;
    uStack_744 = (ushort)bStack_3e6;
    uStack_742 = (ushort)bStack_3e5;
    uStack_73e = (ushort)bStack_3e3;
    uStack_73c = (ushort)bStack_3e2;
    uStack_73a = (ushort)bStack_3e1;
    uStack_756 = (ushort)bStack_447;
    uStack_754 = (ushort)bStack_446;
    uStack_752 = (ushort)bStack_445;
    uStack_74e = (ushort)bStack_443;
    uStack_74c = (ushort)bStack_442;
    uStack_74a = (ushort)bStack_441;
    uStack_766 = (ushort)bStack_25f;
    uStack_764 = (ushort)bStack_25e;
    uStack_762 = (ushort)bStack_25d;
    uStack_75e = (ushort)bStack_25b;
    uStack_75c = (ushort)bStack_25a;
    uStack_75a = (ushort)bStack_259;
    uStack_776 = (ushort)bStack_2bf;
    uStack_774 = (ushort)bStack_2be;
    uStack_772 = (ushort)bStack_2bd;
    uStack_76e = (ushort)bStack_2bb;
    uStack_76c = (ushort)bStack_2ba;
    uStack_76a = (ushort)bStack_2b9;
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,sVar25));
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,CONCAT12(p00_2[0]._2_1_,sVar37));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    sStack_786 = (short)((uint)uVar10 >> 0x10);
    sStack_784 = (short)((uint6)uVar11 >> 0x20);
    sStack_782 = (short)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x30);
    sStack_77e = (short)((uint)uVar12 >> 0x10);
    sStack_77c = (short)((uint6)uVar13 >> 0x20);
    sStack_77a = (short)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x30);
    sVar25 = sVar25 + 4;
    sVar37 = sVar37 + 4;
    p01_2[1]._2_1_ = (char)(sStack_786 + 4);
    p01_2[1]._3_1_ = (byte)((ushort)(sStack_786 + 4) >> 8);
    p01_2[1]._4_1_ = (char)(sStack_784 + 4);
    p01_2[1]._5_1_ = (byte)((ushort)(sStack_784 + 4) >> 8);
    p01_2[1]._6_1_ = (char)(sStack_782 + 4);
    p01_2[1]._7_1_ = (byte)((ushort)(sStack_782 + 4) >> 8);
    p00_2[0]._2_1_ = (char)(sStack_77e + 4);
    p00_2[0]._3_1_ = (byte)((ushort)(sStack_77e + 4) >> 8);
    p00_2[0]._4_1_ = (char)(sStack_77c + 4);
    p00_2[0]._5_1_ = (byte)((ushort)(sStack_77c + 4) >> 8);
    p00_2[0]._6_1_ = (char)(sStack_77a + 4);
    p00_2[0]._7_1_ = (byte)((ushort)(sStack_77a + 4) >> 8);
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,sVar25));
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,CONCAT12(p00_2[0]._2_1_,sVar37));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    sStack_7c6 = (short)((uint)uVar10 >> 0x10);
    sStack_7c4 = (short)((uint6)uVar11 >> 0x20);
    sStack_7c2 = (short)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x30);
    sStack_7be = (short)((uint)uVar12 >> 0x10);
    sStack_7bc = (short)((uint6)uVar13 >> 0x20);
    sStack_7ba = (short)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x30);
    uVar23 = sVar25 + (ushort)local_3e8 + (ushort)local_448;
    sStack_7c6 = sStack_7c6 + uStack_746 + uStack_756;
    sStack_7c4 = sStack_7c4 + uStack_744 + uStack_754;
    sStack_7c2 = sStack_7c2 + uStack_742 + uStack_752;
    uVar32 = sVar37 + (ushort)bStack_3e4 + (ushort)bStack_444;
    sStack_7be = sStack_7be + uStack_73e + uStack_74e;
    sStack_7bc = sStack_7bc + uStack_73c + uStack_74c;
    sStack_7ba = sStack_7ba + uStack_73a + uStack_74a;
    p01_2[1]._2_1_ = (char)sStack_7c6;
    p01_2[1]._3_1_ = (byte)((ushort)sStack_7c6 >> 8);
    p01_2[1]._4_1_ = (char)sStack_7c4;
    p01_2[1]._5_1_ = (byte)((ushort)sStack_7c4 >> 8);
    p01_2[1]._6_1_ = (char)sStack_7c2;
    p01_2[1]._7_1_ = (byte)((ushort)sStack_7c2 >> 8);
    p00_2[0]._2_1_ = (char)sStack_7be;
    p00_2[0]._3_1_ = (byte)((ushort)sStack_7be >> 8);
    p00_2[0]._4_1_ = (char)sStack_7bc;
    p00_2[0]._5_1_ = (byte)((ushort)sStack_7bc >> 8);
    p00_2[0]._6_1_ = (char)sStack_7ba;
    p00_2[0]._7_1_ = (byte)((ushort)sStack_7ba >> 8);
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,uVar23));
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,CONCAT12(p00_2[0]._2_1_,uVar32));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    uVar23 = uVar23 >> 3;
    uVar32 = uVar32 >> 3;
    p01_2[1]._2_1_ = (char)(ushort)((uint)uVar10 >> 0x13);
    p01_2[1]._3_1_ = p01_2[1]._3_1_ >> 3;
    p01_2[1]._4_1_ = (char)(ushort)((uint6)uVar11 >> 0x23);
    p01_2[1]._5_1_ = p01_2[1]._5_1_ >> 3;
    p01_2[1]._6_1_ =
         (char)(ushort)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x33);
    p01_2[1]._7_1_ = p01_2[1]._7_1_ >> 3;
    p00_2[0]._2_1_ = (char)(ushort)((uint)uVar12 >> 0x13);
    p00_2[0]._3_1_ = p00_2[0]._3_1_ >> 3;
    p00_2[0]._4_1_ = (char)(ushort)((uint6)uVar13 >> 0x23);
    p00_2[0]._5_1_ = p00_2[0]._5_1_ >> 3;
    p00_2[0]._6_1_ =
         (char)(ushort)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x33);
    p00_2[0]._7_1_ = p00_2[0]._7_1_ >> 3;
    uVar24 = (ushort)(((ushort)bStack_280 + (ushort)bStack_2a0) * 3 + 4 +
                     (ushort)bStack_260 + (ushort)bStack_2c0) >> 3;
    uVar29 = (ushort)((uStack_726 + uStack_736) * 3 + 4 + uStack_766 + uStack_776) >> 3;
    uVar30 = (ushort)((uStack_724 + uStack_734) * 3 + 4 + uStack_764 + uStack_774) >> 3;
    uVar31 = (ushort)((uStack_722 + uStack_732) * 3 + 4 + uStack_762 + uStack_772) >> 3;
    uVar33 = (ushort)(((ushort)bStack_27c + (ushort)bStack_29c) * 3 + 4 +
                     (ushort)bStack_25c + (ushort)bStack_2bc) >> 3;
    uVar34 = (ushort)((uStack_71e + uStack_72e) * 3 + 4 + uStack_75e + uStack_76e) >> 3;
    uVar35 = (ushort)((uStack_71c + uStack_72c) * 3 + 4 + uStack_75c + uStack_76c) >> 3;
    uVar36 = (ushort)((uStack_71a + uStack_72a) * 3 + 4 + uStack_75a + uStack_76a) >> 3;
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,uVar23));
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,CONCAT12(p00_2[0]._2_1_,uVar32));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    uStack_4a6 = (ushort)((uint)uVar10 >> 0x10);
    uStack_4a4 = (ushort)((uint6)uVar11 >> 0x20);
    uStack_4a2 = (ushort)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x30);
    uStack_49e = (ushort)((uint)uVar12 >> 0x10);
    uStack_49c = (ushort)((uint6)uVar13 >> 0x20);
    uStack_49a = (ushort)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x30);
    *(ulong *)((long)&left_size + (long)src1._4_4_) =
         CONCAT17((uStack_49a != 0) * (uStack_49a < 0x100) * p00_2[0]._6_1_ - (0xff < uStack_49a),
                  CONCAT16((uStack_49c != 0) * (uStack_49c < 0x100) * p00_2[0]._4_1_ -
                           (0xff < uStack_49c),
                           CONCAT15((uStack_49e != 0) * (uStack_49e < 0x100) * p00_2[0]._2_1_ -
                                    (0xff < uStack_49e),
                                    CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 -
                                             (0xff < uVar32),
                                             CONCAT13((uStack_4a2 != 0) * (uStack_4a2 < 0x100) *
                                                      p01_2[1]._6_1_ - (0xff < uStack_4a2),
                                                      CONCAT12((uStack_4a4 != 0) *
                                                               (uStack_4a4 < 0x100) * p01_2[1]._4_1_
                                                               - (0xff < uStack_4a4),
                                                               CONCAT11((uStack_4a6 != 0) *
                                                                        (uStack_4a6 < 0x100) *
                                                                        p01_2[1]._2_1_ -
                                                                        (0xff < uStack_4a6),
                                                                        (uVar23 != 0) *
                                                                        (uVar23 < 0x100) *
                                                                        (char)uVar23 -
                                                                        (0xff < uVar23))))))));
    *(ulong *)(first_line + src1._4_4_) =
         CONCAT17((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                           CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 -
                                    (0xff < uVar34),
                                    CONCAT14((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 -
                                             (0xff < uVar33),
                                             CONCAT13((uVar31 != 0) * (uVar31 < 0x100) *
                                                      (char)uVar31 - (0xff < uVar31),
                                                      CONCAT12((uVar30 != 0) * (uVar30 < 0x100) *
                                                               (char)uVar30 - (0xff < uVar30),
                                                               CONCAT11((uVar29 != 0) *
                                                                        (uVar29 < 0x100) *
                                                                        (char)uVar29 -
                                                                        (0xff < uVar29),
                                                                        (uVar24 != 0) *
                                                                        (uVar24 < 0x100) *
                                                                        (char)uVar24 -
                                                                        (0xff < uVar24))))))));
    uStack_806 = (ushort)bStack_3e7;
    uStack_804 = (ushort)bStack_3e6;
    uStack_802 = (ushort)bStack_3e5;
    uStack_7fe = (ushort)bStack_3e3;
    uStack_7fc = (ushort)bStack_3e2;
    uStack_7fa = (ushort)bStack_3e1;
    uStack_816 = (ushort)bStack_407;
    uStack_814 = (ushort)bStack_406;
    uStack_812 = (ushort)bStack_405;
    uStack_80e = (ushort)bStack_403;
    uStack_80c = (ushort)bStack_402;
    uStack_80a = (ushort)bStack_401;
    p01_2[1]._2_1_ = (char)(uStack_806 + uStack_816);
    p01_2[1]._3_1_ = (byte)((ushort)(uStack_806 + uStack_816) >> 8);
    p01_2[1]._4_1_ = (char)(uStack_804 + uStack_814);
    p01_2[1]._5_1_ = (byte)((ushort)(uStack_804 + uStack_814) >> 8);
    p01_2[1]._6_1_ = (char)(uStack_802 + uStack_812);
    p01_2[1]._7_1_ = (byte)((ushort)(uStack_802 + uStack_812) >> 8);
    p00_2[0]._2_1_ = (char)(uStack_7fe + uStack_80e);
    p00_2[0]._3_1_ = (byte)((ushort)(uStack_7fe + uStack_80e) >> 8);
    p00_2[0]._4_1_ = (char)(uStack_7fc + uStack_80c);
    p00_2[0]._5_1_ = (byte)((ushort)(uStack_7fc + uStack_80c) >> 8);
    p00_2[0]._6_1_ = (char)(uStack_7fa + uStack_80a);
    p00_2[0]._7_1_ = (byte)((ushort)(uStack_7fa + uStack_80a) >> 8);
    uStack_826 = (ushort)bStack_407;
    uStack_824 = (ushort)bStack_406;
    uStack_822 = (ushort)bStack_405;
    uStack_81e = (ushort)bStack_403;
    uStack_81c = (ushort)bStack_402;
    uStack_81a = (ushort)bStack_401;
    uStack_836 = (ushort)bStack_427;
    uStack_834 = (ushort)bStack_426;
    uStack_832 = (ushort)bStack_425;
    uStack_82e = (ushort)bStack_423;
    uStack_82c = (ushort)bStack_422;
    uStack_82a = (ushort)bStack_421;
    uStack_846 = (ushort)bStack_25f;
    uStack_844 = (ushort)bStack_25e;
    uStack_842 = (ushort)bStack_25d;
    uStack_83e = (ushort)bStack_25b;
    uStack_83c = (ushort)bStack_25a;
    uStack_83a = (ushort)bStack_259;
    uStack_856 = (ushort)bStack_27f;
    uStack_854 = (ushort)bStack_27e;
    uStack_852 = (ushort)bStack_27d;
    uStack_84e = (ushort)bStack_27b;
    uStack_84c = (ushort)bStack_27a;
    uStack_84a = (ushort)bStack_279;
    uStack_866 = (ushort)bStack_27f;
    uStack_864 = (ushort)bStack_27e;
    uStack_862 = (ushort)bStack_27d;
    uStack_85e = (ushort)bStack_27b;
    uStack_85c = (ushort)bStack_27a;
    uStack_85a = (ushort)bStack_279;
    uStack_876 = (ushort)bStack_29f;
    uStack_874 = (ushort)bStack_29e;
    uStack_872 = (ushort)bStack_29d;
    uStack_86e = (ushort)bStack_29b;
    uStack_86c = (ushort)bStack_29a;
    uStack_86a = (ushort)bStack_299;
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,(ushort)local_3e8 + (ushort)local_408))
    ;
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,
                      CONCAT12(p00_2[0]._2_1_,(ushort)bStack_3e4 + (ushort)bStack_404));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    sStack_886 = (short)((uint)uVar10 >> 0x10);
    sStack_884 = (short)((uint6)uVar11 >> 0x20);
    sStack_882 = (short)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x30);
    sStack_87e = (short)((uint)uVar12 >> 0x10);
    sStack_87c = (short)((uint6)uVar13 >> 0x20);
    sStack_87a = (short)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x30);
    sVar25 = (ushort)local_3e8 + (ushort)local_408 + 2;
    sVar37 = (ushort)bStack_3e4 + (ushort)bStack_404 + 2;
    p01_2[1]._2_1_ = (char)(sStack_886 + 2);
    p01_2[1]._3_1_ = (byte)((ushort)(sStack_886 + 2) >> 8);
    p01_2[1]._4_1_ = (char)(sStack_884 + 2);
    p01_2[1]._5_1_ = (byte)((ushort)(sStack_884 + 2) >> 8);
    p01_2[1]._6_1_ = (char)(sStack_882 + 2);
    p01_2[1]._7_1_ = (byte)((ushort)(sStack_882 + 2) >> 8);
    p00_2[0]._2_1_ = (char)(sStack_87e + 2);
    p00_2[0]._3_1_ = (byte)((ushort)(sStack_87e + 2) >> 8);
    p00_2[0]._4_1_ = (char)(sStack_87c + 2);
    p00_2[0]._5_1_ = (byte)((ushort)(sStack_87c + 2) >> 8);
    p00_2[0]._6_1_ = (char)(sStack_87a + 2);
    p00_2[0]._7_1_ = (byte)((ushort)(sStack_87a + 2) >> 8);
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,sVar25));
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,CONCAT12(p00_2[0]._2_1_,sVar37));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    sStack_8c6 = (short)((uint)uVar10 >> 0x10);
    sStack_8c4 = (short)((uint6)uVar11 >> 0x20);
    sStack_8c2 = (short)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x30);
    sStack_8be = (short)((uint)uVar12 >> 0x10);
    sStack_8bc = (short)((uint6)uVar13 >> 0x20);
    sStack_8ba = (short)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x30);
    uVar23 = sVar25 + (ushort)local_408 + (ushort)local_428;
    sStack_8c6 = sStack_8c6 + uStack_826 + uStack_836;
    sStack_8c4 = sStack_8c4 + uStack_824 + uStack_834;
    sStack_8c2 = sStack_8c2 + uStack_822 + uStack_832;
    uVar32 = sVar37 + (ushort)bStack_404 + (ushort)bStack_424;
    sStack_8be = sStack_8be + uStack_81e + uStack_82e;
    sStack_8bc = sStack_8bc + uStack_81c + uStack_82c;
    sStack_8ba = sStack_8ba + uStack_81a + uStack_82a;
    p01_2[1]._2_1_ = (char)sStack_8c6;
    p01_2[1]._3_1_ = (byte)((ushort)sStack_8c6 >> 8);
    p01_2[1]._4_1_ = (char)sStack_8c4;
    p01_2[1]._5_1_ = (byte)((ushort)sStack_8c4 >> 8);
    p01_2[1]._6_1_ = (char)sStack_8c2;
    p01_2[1]._7_1_ = (byte)((ushort)sStack_8c2 >> 8);
    p00_2[0]._2_1_ = (char)sStack_8be;
    p00_2[0]._3_1_ = (byte)((ushort)sStack_8be >> 8);
    p00_2[0]._4_1_ = (char)sStack_8bc;
    p00_2[0]._5_1_ = (byte)((ushort)sStack_8bc >> 8);
    p00_2[0]._6_1_ = (char)sStack_8ba;
    p00_2[0]._7_1_ = (byte)((ushort)sStack_8ba >> 8);
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,uVar23));
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,CONCAT12(p00_2[0]._2_1_,uVar32));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    uVar23 = uVar23 >> 2;
    uVar32 = uVar32 >> 2;
    p01_2[1]._2_1_ = (char)(ushort)((uint)uVar10 >> 0x12);
    p01_2[1]._3_1_ = p01_2[1]._3_1_ >> 2;
    p01_2[1]._4_1_ = (char)(ushort)((uint6)uVar11 >> 0x22);
    p01_2[1]._5_1_ = p01_2[1]._5_1_ >> 2;
    p01_2[1]._6_1_ =
         (char)(ushort)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x32);
    p01_2[1]._7_1_ = p01_2[1]._7_1_ >> 2;
    p00_2[0]._2_1_ = (char)(ushort)((uint)uVar12 >> 0x12);
    p00_2[0]._3_1_ = p00_2[0]._3_1_ >> 2;
    p00_2[0]._4_1_ = (char)(ushort)((uint6)uVar13 >> 0x22);
    p00_2[0]._5_1_ = p00_2[0]._5_1_ >> 2;
    p00_2[0]._6_1_ =
         (char)(ushort)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x32);
    p00_2[0]._7_1_ = p00_2[0]._7_1_ >> 2;
    uVar24 = (ushort)((ushort)bStack_260 + (ushort)bStack_280 + 2 +
                     (ushort)bStack_280 + (ushort)bStack_2a0) >> 2;
    uVar29 = (ushort)(uStack_846 + uStack_856 + 2 + uStack_866 + uStack_876) >> 2;
    uVar30 = (ushort)(uStack_844 + uStack_854 + 2 + uStack_864 + uStack_874) >> 2;
    uVar31 = (ushort)(uStack_842 + uStack_852 + 2 + uStack_862 + uStack_872) >> 2;
    uVar33 = (ushort)((ushort)bStack_25c + (ushort)bStack_27c + 2 +
                     (ushort)bStack_27c + (ushort)bStack_29c) >> 2;
    uVar34 = (ushort)(uStack_83e + uStack_84e + 2 + uStack_85e + uStack_86e) >> 2;
    uVar35 = (ushort)(uStack_83c + uStack_84c + 2 + uStack_85c + uStack_86c) >> 2;
    uVar36 = (ushort)(uStack_83a + uStack_84a + 2 + uStack_85a + uStack_86a) >> 2;
    uVar10 = CONCAT13(p01_2[1]._3_1_,CONCAT12(p01_2[1]._2_1_,uVar23));
    uVar11 = CONCAT15(p01_2[1]._5_1_,CONCAT14(p01_2[1]._4_1_,uVar10));
    uVar12 = CONCAT13(p00_2[0]._3_1_,CONCAT12(p00_2[0]._2_1_,uVar32));
    uVar13 = CONCAT15(p00_2[0]._5_1_,CONCAT14(p00_2[0]._4_1_,uVar12));
    uStack_4c6 = (ushort)((uint)uVar10 >> 0x10);
    uStack_4c4 = (ushort)((uint6)uVar11 >> 0x20);
    uStack_4c2 = (ushort)(CONCAT17(p01_2[1]._7_1_,CONCAT16(p01_2[1]._6_1_,uVar11)) >> 0x30);
    uStack_4be = (ushort)((uint)uVar12 >> 0x10);
    uStack_4bc = (ushort)((uint6)uVar13 >> 0x20);
    uStack_4ba = (ushort)(CONCAT17(p00_2[0]._7_1_,CONCAT16(p00_2[0]._6_1_,uVar13)) >> 0x30);
    puVar22 = (undefined8 *)((long)&left_size + src1._4_4_ + lVar20 + 0xad8);
    *puVar22 = CONCAT17((uStack_4ba != 0) * (uStack_4ba < 0x100) * p00_2[0]._6_1_ -
                        (0xff < uStack_4ba),
                        CONCAT16((uStack_4bc != 0) * (uStack_4bc < 0x100) * p00_2[0]._4_1_ -
                                 (0xff < uStack_4bc),
                                 CONCAT15((uStack_4be != 0) * (uStack_4be < 0x100) * p00_2[0]._2_1_
                                          - (0xff < uStack_4be),
                                          CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 -
                                                   (0xff < uVar32),
                                                   CONCAT13((uStack_4c2 != 0) * (uStack_4c2 < 0x100)
                                                            * p01_2[1]._6_1_ - (0xff < uStack_4c2),
                                                            CONCAT12((uStack_4c4 != 0) *
                                                                     (uStack_4c4 < 0x100) *
                                                                     p01_2[1]._4_1_ -
                                                                     (0xff < uStack_4c4),
                                                                     CONCAT11((uStack_4c6 != 0) *
                                                                              (uStack_4c6 < 0x100) *
                                                                              p01_2[1]._2_1_ -
                                                                              (0xff < uStack_4c6),
                                                                              (uVar23 != 0) *
                                                                              (uVar23 < 0x100) *
                                                                              (char)uVar23 -
                                                                              (0xff < uVar23))))))))
    ;
    puVar22[1] = CONCAT17((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                          CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35)
                                   ,CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 -
                                             (0xff < uVar34),
                                             CONCAT14((uVar33 != 0) * (uVar33 < 0x100) *
                                                      (char)uVar33 - (0xff < uVar33),
                                                      CONCAT13((uVar31 != 0) * (uVar31 < 0x100) *
                                                               (char)uVar31 - (0xff < uVar31),
                                                               CONCAT12((uVar30 != 0) *
                                                                        (uVar30 < 0x100) *
                                                                        (char)uVar30 -
                                                                        (0xff < uVar30),
                                                                        CONCAT11((uVar29 != 0) *
                                                                                 (uVar29 < 0x100) *
                                                                                 (char)uVar29 -
                                                                                 (0xff < uVar29),
                                                                                 (uVar24 != 0) *
                                                                                 (uVar24 < 0x100) *
                                                                                 (char)uVar24 -
                                                                                 (0xff < uVar24)))))
                                            )));
    dst_local = dst_local + 0x10;
  }
  lVar19 = (long)iVar21 + -0xad8;
  lVar20 = iVar21 + lVar20;
  first_line._216_4_ = (int)first_line._216_4_ >> 1;
  _mode_local = dst;
  if (first_line._220_4_ == 4) {
    for (src1._4_4_ = 0; src1._4_4_ < (int)first_line._216_4_; src1._4_4_ = src1._4_4_ + 1) {
      *(undefined4 *)_mode_local = *(undefined4 *)((long)&left_size + (lVar19 - src1._4_4_) + 0xad8)
      ;
      *(undefined4 *)(_mode_local + i_dst) =
           *(undefined4 *)((long)&left_size + (lVar20 - src1._4_4_) + 0xad8);
      _mode_local = _mode_local + (i_dst << 1);
    }
  }
  else if (first_line._220_4_ == 8) {
    for (src1._4_4_ = 0; src1._4_4_ < (int)first_line._216_4_; src1._4_4_ = src1._4_4_ + 1) {
      *(undefined8 *)_mode_local = *(undefined8 *)((long)&left_size + (lVar19 - src1._4_4_) + 0xad8)
      ;
      *(undefined8 *)(_mode_local + i_dst) =
           *(undefined8 *)((long)&left_size + (lVar20 - src1._4_4_) + 0xad8);
      _mode_local = _mode_local + (i_dst << 1);
    }
  }
  else if (first_line._220_4_ == 0x10) {
    for (src1._4_4_ = 0; src1._4_4_ < (int)first_line._216_4_; src1._4_4_ = src1._4_4_ + 1) {
      *(undefined8 *)_mode_local =
           *(undefined8 *)((long)&left_size + -(long)src1._4_4_ + lVar19 + 0xad8);
      *(undefined8 *)(_mode_local + 8) =
           *(undefined8 *)(first_line + -(long)src1._4_4_ + (long)iVar21);
      *(undefined8 *)(_mode_local + i_dst) =
           *(undefined8 *)((long)&left_size + -(long)src1._4_4_ + lVar20 + 0xad8);
      *(undefined8 *)(_mode_local + (long)i_dst + 8) =
           *(undefined8 *)(first_line + -(long)src1._4_4_ + lVar20 + 0xad8);
      _mode_local = _mode_local + (i_dst << 1);
    }
  }
  else {
    for (src1._4_4_ = 0; src1._4_4_ < (int)first_line._216_4_; src1._4_4_ = src1._4_4_ + 1) {
      memcpy(_mode_local,(void *)((long)&left_size + (lVar19 - src1._4_4_) + 0xad8),
             (long)(int)first_line._220_4_);
      memcpy(_mode_local + i_dst,(void *)((long)&left_size + (lVar20 - src1._4_4_) + 0xad8),
             (long)(int)first_line._220_4_);
      _mode_local = _mode_local + (i_dst << 1);
    }
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_xy_16_sse(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
	ALIGNED_16(pel first_line[2 * (64 + 48)]);
	int line_size = width + height / 2 - 1;
	int left_size = line_size - width;
	int aligned_line_size = ((line_size + 31) >> 4) << 4;
    pel *pfirst[2];
	__m128i zero = _mm_setzero_si128();
	__m128i coeff2 = _mm_set1_epi16(2);
	__m128i coeff3 = _mm_set1_epi16(3);
	__m128i coeff4 = _mm_set1_epi16(4);
	__m128i shuffle1 = _mm_setr_epi8(0, 2, 4, 6, 8, 10, 12, 14, 1, 3, 5, 7, 9, 11, 13, 15);
	__m128i shuffle2 = _mm_setr_epi8(1, 3, 5, 7, 9, 11, 13, 15, 0, 2, 4, 6, 8, 10, 12, 14);
	int i;
    pel *src1;

    pfirst[0] = first_line;
    pfirst[1] = first_line + aligned_line_size;

	src -= height - 2;

	src1 = src;

	for (i = 0; i < left_size - 4; i += 8, src += 16)
	{
		__m128i p00, p01, p10, p11;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);

		__m128i H0 = _mm_unpackhi_epi8(S0, zero);
		__m128i H1 = _mm_unpackhi_epi8(S1, zero);
		__m128i H2 = _mm_unpackhi_epi8(S2, zero);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H0, H1);
		p11 = _mm_add_epi16(H1, H2);

		p00 = _mm_add_epi16(p00, coeff2);
		p10 = _mm_add_epi16(p10, coeff2);

		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 2);
		p10 = _mm_srli_epi16(p10, 2);
		p00 = _mm_packus_epi16(p00, p10);

		p10 = _mm_shuffle_epi8(p00, shuffle2);
		p00 = _mm_shuffle_epi8(p00, shuffle1);
		_mm_storel_epi64((__m128i*)&pfirst[1][i], p00);
		_mm_storel_epi64((__m128i*)&pfirst[0][i], p10);
	}

	if (i < left_size)
	{
		__m128i p00, p01;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p00 = _mm_add_epi16(p00, coeff2);
		p00 = _mm_add_epi16(p00, p01);
		p00 = _mm_srli_epi16(p00, 2);
		p00 = _mm_packus_epi16(p00, p00);

		p01 = _mm_shuffle_epi8(p00, shuffle2);
		p00 = _mm_shuffle_epi8(p00, shuffle1);
		((int*)&pfirst[1][i])[0] = _mm_cvtsi128_si32(p00);
		((int*)&pfirst[0][i])[0] = _mm_cvtsi128_si32(p01);
	}

	src = src1 + left_size + left_size;

	for (i = left_size; i < line_size; i += 16, src += 16)
	{
		__m128i p00, p01, p10, p11;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S3 = _mm_loadu_si128((__m128i*)(src + 2));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);
		__m128i L3 = _mm_unpacklo_epi8(S3, zero);

		__m128i H0 = _mm_unpackhi_epi8(S0, zero);
		__m128i H1 = _mm_unpackhi_epi8(S1, zero);
		__m128i H2 = _mm_unpackhi_epi8(S2, zero);
		__m128i H3 = _mm_unpackhi_epi8(S3, zero);

		p00 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H1, H2);
		p00 = _mm_mullo_epi16(p00, coeff3);
		p10 = _mm_mullo_epi16(p10, coeff3);

		p01 = _mm_add_epi16(L0, L3);
		p11 = _mm_add_epi16(H0, H3);
		p00 = _mm_add_epi16(p00, coeff4);
		p10 = _mm_add_epi16(p10, coeff4);
		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 3);
		p10 = _mm_srli_epi16(p10, 3);

		p00 = _mm_packus_epi16(p00, p10);
		_mm_storeu_si128((__m128i*)&pfirst[0][i], p00);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H0, H1);
		p11 = _mm_add_epi16(H1, H2);

		p00 = _mm_add_epi16(p00, coeff2);
		p10 = _mm_add_epi16(p10, coeff2);

		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 2);
		p10 = _mm_srli_epi16(p10, 2);

		p00 = _mm_packus_epi16(p00, p10);
		_mm_storeu_si128((__m128i*)&pfirst[1][i], p00);
	}

	pfirst[0] += left_size;
	pfirst[1] += left_size;

	height >>= 1;

    switch (width) {
    case 4:
        for (i = 0; i < height; i++) {
            CP32(dst,         pfirst[0] - i);
            CP32(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    case 8:
        for (i = 0; i < height; i++) {
            CP64(dst,         pfirst[0] - i);
            CP64(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    case 16:
        for (i = 0; i < height; i++) {
            CP128(dst,         pfirst[0] - i);
            CP128(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    default:
        for (i = 0; i < height; i++) {
            memcpy(dst,         pfirst[0] - i, width * sizeof(pel));
            memcpy(dst + i_dst, pfirst[1] - i, width * sizeof(pel));
            dst += (i_dst << 1);
        }
        break;
    }
	
}